

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O2

void __thiscall pktalloc::Allocator::moveLastFewWindowsToFull(Allocator *this,uint count)

{
  uint uVar1;
  WindowHeader *pWVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar5 = (this->FullWindows).Size;
  LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_Copy(&this->FullWindows,uVar5 + count);
  uVar1 = (this->PreferredWindows).Size;
  uVar4 = count;
  uVar3 = uVar1;
  while( true ) {
    uVar3 = uVar3 - 1;
    bVar6 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar6) break;
    pWVar2 = (this->PreferredWindows).DataPtr[(int)uVar3];
    (this->FullWindows).DataPtr[(int)uVar5] = pWVar2;
    pWVar2->FullListIndex = uVar5;
    uVar5 = uVar5 + 1;
  }
  LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_Copy
            (&this->PreferredWindows,uVar1 - count);
  return;
}

Assistant:

void Allocator::moveLastFewWindowsToFull(unsigned count)
{
    const unsigned existingFullCount = FullWindows.GetSize();
    FullWindows.SetSize_Copy(existingFullCount + count);

    const unsigned existingPreferredCount = PreferredWindows.GetSize();
    PKTALLOC_DEBUG_ASSERT(existingPreferredCount >= count);

    // For each window to move:
    for (unsigned i = 0; i < count; ++i)
    {
        const unsigned windowIndex = existingPreferredCount - 1 - i;
        PKTALLOC_DEBUG_ASSERT(windowIndex < PreferredWindows.GetSize());
        WindowHeader* window = PreferredWindows.GetRef(windowIndex);
        PKTALLOC_DEBUG_ASSERT(window);

        // Move the window to the full list
        FullWindows.GetRef(existingFullCount + i) = window;
        window->FullListIndex = existingFullCount + i;
    }

    PreferredWindows.SetSize_Copy(existingPreferredCount - count);

    ALLOC_DEBUG_INTEGRITY_CHECK();
}